

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# document.h
# Opt level: O0

GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> * __thiscall
rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::operator=
          (GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *this,
          GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *rhs)

{
  undefined1 local_28 [8];
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> temp;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *rhs_local;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *this_local;
  
  if (this != rhs) {
    temp.data_.a.elements = rhs;
    GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)local_28);
    RawAssign((GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)local_28,
              temp.data_.a.elements);
    ~GenericValue(this);
    RawAssign(this,(GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)local_28);
    ~GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)local_28);
  }
  return this;
}

Assistant:

GenericValue& operator=(GenericValue& rhs) RAPIDJSON_NOEXCEPT {
        if (RAPIDJSON_LIKELY(this != &rhs)) {
            // Can't destroy "this" before assigning "rhs", otherwise "rhs"
            // could be used after free if it's an sub-Value of "this",
            // hence the temporary danse.
            GenericValue temp;
            temp.RawAssign(rhs);
            this->~GenericValue();
            RawAssign(temp);
        }
        return *this;
    }